

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O3

void fixRpathsOnFile(string *original_file,string *file_to_fix)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer pbVar8;
  undefined8 uVar9;
  string command;
  undefined1 local_138 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pointer local_38;
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Settings::fileHasRpath(original_file);
  if (bVar2) {
    Settings::getRpathsForFile
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,original_file);
    local_d8._16_8_ =
         local_f8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8._8_8_ =
         local_f8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_d8._0_8_ =
         local_f8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138._16_8_;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138._0_8_;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_138._8_8_;
    local_138._0_8_ = (pointer)0x0;
    local_138._8_8_ = (pointer)0x0;
    local_138._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_138);
    local_38 = local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar8 = local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"install_name_tool -rpath ","");
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_58,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar4->_M_dataplus)._M_p;
        paVar6 = &pbVar4->field_2;
        if (paVar7 == paVar6) {
          local_78.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_78.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_78._M_dataplus._M_p = (pointer)paVar7;
        }
        local_78._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_78," ");
        local_b8._M_allocated_capacity = (size_type)(pbVar4->_M_dataplus)._M_p;
        paVar7 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_allocated_capacity == paVar7) {
          local_a8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_a8._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_b8._M_allocated_capacity = (size_type)&local_a8;
        }
        else {
          local_a8._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_b8._8_8_ = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        Settings::insideLibPath_abi_cxx11_();
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_allocated_capacity != &local_a8) {
          uVar9 = local_a8._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_98._M_string_length + local_b8._8_8_) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar9 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_98._M_string_length + local_b8._8_8_) goto LAB_0010a66d;
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_98,0,0,(char *)local_b8._M_allocated_capacity,local_b8._8_8_);
        }
        else {
LAB_0010a66d:
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_b8,local_98._M_dataplus._M_p,local_98._M_string_length);
        }
        local_118._M_allocated_capacity = (size_type)(pbVar4->_M_dataplus)._M_p;
        paVar7 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_allocated_capacity == paVar7) {
          local_108._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_108._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_118._M_allocated_capacity = (size_type)&local_108;
        }
        else {
          local_108._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        local_118._8_8_ = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar4->_M_string_length = 0;
        paVar7->_M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_118," ");
        local_138._0_8_ = local_138 + 0x10;
        pbVar1 = (pointer)(pbVar4->_M_dataplus)._M_p;
        paVar7 = &pbVar4->field_2;
        if (pbVar1 == (pointer)paVar7) {
          local_138._16_8_ = paVar7->_M_allocated_capacity;
          local_138._24_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_138._16_8_ = paVar7->_M_allocated_capacity;
          local_138._0_8_ = pbVar1;
        }
        local_138._8_8_ = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,(file_to_fix->_M_dataplus)._M_p,file_to_fix->_M_string_length);
        local_d8._0_8_ = local_d8 + 0x10;
        pbVar1 = (pointer)(pbVar4->_M_dataplus)._M_p;
        paVar7 = &pbVar4->field_2;
        if (pbVar1 == (pointer)paVar7) {
          local_d8._16_8_ = paVar7->_M_allocated_capacity;
          local_d8._24_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_d8._16_8_ = paVar7->_M_allocated_capacity;
          local_d8._0_8_ = pbVar1;
        }
        local_d8._8_8_ = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_allocated_capacity != &local_108) {
          operator_delete((void *)local_118._M_allocated_capacity,
                          local_108._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_allocated_capacity != &local_a8) {
          operator_delete((void *)local_b8._M_allocated_capacity,local_a8._M_allocated_capacity + 1)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        iVar3 = systemp((string *)local_d8);
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "\n\n/!\\ ERROR: An error occured while trying to fix rpath ",0x38);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(pbVar8->_M_dataplus)._M_p,
                              pbVar8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," of ",4);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(file_to_fix->_M_dataplus)._M_p,file_to_fix->_M_string_length);
          std::endl<char,std::char_traits<char>>(poVar5);
          exit(1);
        }
        if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != local_38);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return;
}

Assistant:

void fixRpathsOnFile(const string& original_file, const string& file_to_fix)
{
    vector<string> rpaths_to_fix;
    if (!Settings::fileHasRpath(original_file))
        return;

    rpaths_to_fix = Settings::getRpathsForFile(original_file);
    for (const auto& rpath_to_fix : rpaths_to_fix)
    {
        string command = string("install_name_tool -rpath ")
                       + rpath_to_fix + " " + Settings::insideLibPath() + " " + file_to_fix;
        if (systemp(command) != 0)
        {
            cerr << "\n\n/!\\ ERROR: An error occured while trying to fix rpath "
                      << rpath_to_fix << " of " << file_to_fix << endl;
            exit(1);
        }
    }
}